

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# md5.cpp
# Opt level: O0

ostream * operator<<(ostream *out,MD5 md5)

{
  ostream *poVar1;
  ostream *in_RDI;
  MD5 *in_stack_00000008;
  string local_28 [40];
  
  MD5::hexdigest_abi_cxx11_(in_stack_00000008);
  poVar1 = std::operator<<(in_RDI,local_28);
  std::__cxx11::string::~string(local_28);
  return poVar1;
}

Assistant:

std::ostream& operator<<(std::ostream& out, MD5 md5)
{
  return out << md5.hexdigest();
}